

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize,int extDict)

{
  BYTE *pBVar1;
  int iVar2;
  ZSTD_blockCompressor p_Var3;
  BYTE *pBVar4;
  size_t sVar5;
  U32 *in_RCX;
  seqStore_t *in_RDX;
  ZSTD_matchState_t *in_RSI;
  long in_RDI;
  ZSTD_compressionParameters *in_R8;
  BYTE *in_R9;
  bool bVar6;
  rawSeq rVar7;
  long in_stack_00000008;
  size_t lastLiterals;
  size_t newLitLength;
  int i;
  rawSeq sequence;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  BYTE *base;
  ZSTD_blockCompressor blockCompressor;
  uint minMatch;
  U32 in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar8;
  ZSTD_compressionParameters *in_stack_ffffffffffffff68;
  ZSTD_matchState_t *in_stack_ffffffffffffff70;
  int local_84;
  uint local_78;
  U32 local_6c;
  uint uStack_68;
  BYTE *local_60;
  
  p_Var3 = ZSTD_selectBlockCompressor(in_R8->strategy,(int)lastLiterals);
  pBVar1 = (in_RSI->window).base;
  pBVar4 = in_R9 + in_stack_00000008;
  local_60 = in_R9;
  while( true ) {
    bVar6 = *(ulong *)(in_RDI + 8) < *(ulong *)(in_RDI + 0x10);
    uVar8 = bVar6 && local_60 < pBVar4;
    iVar2 = (int)pBVar1;
    if (!bVar6 || local_60 >= pBVar4) break;
    rVar7 = maybeSplitSequence((rawSeqStore_t *)in_stack_ffffffffffffff70,
                               (U32)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                               (U32)in_stack_ffffffffffffff68);
    local_78 = rVar7.matchLength;
    local_6c = rVar7.offset;
    if (local_6c == 0) break;
    ZSTD_ldm_limitTableUpdate(in_RSI,local_60);
    ZSTD_ldm_fillFastTables
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (void *)CONCAT17(uVar8,in_stack_ffffffffffffff60));
    uStack_68 = rVar7.litLength;
    in_stack_ffffffffffffff70 =
         (ZSTD_matchState_t *)(*p_Var3)(in_RSI,in_RDX,in_RCX,in_R8,local_60,rVar7._4_8_);
    in_RSI->nextToUpdate = (int)(local_60 + uStack_68) - iVar2;
    for (local_84 = 2; 0 < local_84; local_84 = local_84 + -1) {
      in_RCX[local_84] = in_RCX[local_84 + -1];
    }
    *in_RCX = local_6c;
    ZSTD_storeSeq((seqStore_t *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                  (void *)CONCAT17(uVar8,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c,
                  0x2b45d7);
    local_60 = local_60 + uStack_68 + local_78;
  }
  ZSTD_ldm_limitTableUpdate(in_RSI,local_60);
  ZSTD_ldm_fillFastTables
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (void *)CONCAT17(uVar8,in_stack_ffffffffffffff60));
  sVar5 = (*p_Var3)(in_RSI,in_RDX,in_RCX,in_R8,local_60,(long)pBVar4 - (long)local_60);
  in_RSI->nextToUpdate = (int)pBVar4 - iVar2;
  return sVar5;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize,
    int const extDict)
{
    unsigned const minMatch = cParams->searchLength;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, extDict);
    BYTE const* const base = ms->window.base;
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(sequence.offset <= (1U << cParams->windowLog));
        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, cParams, ip);
        /* Run the block compressor */
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, cParams, ip,
                                sequence.litLength);
            ip += sequence.litLength;
            ms->nextToUpdate = (U32)(ip - base);
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, cParams, ip);
    /* Compress the last literals */
    {
        size_t const lastLiterals = blockCompressor(ms, seqStore, rep, cParams,
                                                    ip, iend - ip);
        ms->nextToUpdate = (U32)(iend - base);
        return lastLiterals;
    }
}